

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

timestamp_t __thiscall
duckdb::Interpolator<false>::
Interpolate<unsigned_long,duckdb::timestamp_t,duckdb::QuantileIndirect<duckdb::date_t>>
          (Interpolator<false> *this,unsigned_long lidx,unsigned_long hidx,Vector *result,
          QuantileIndirect<duckdb::date_t> *accessor)

{
  DataChunk *pDVar1;
  date_t dVar2;
  CURSOR *pCVar3;
  bool bVar4;
  timestamp_t tVar5;
  bool bVar6;
  reference pvVar7;
  double dVar8;
  undefined1 auVar9 [12];
  timestamp_t result_1;
  timestamp_t local_58;
  string local_50;
  
  pCVar3 = accessor->data;
  bVar4 = (pCVar3->scan).next_row_index <= lidx;
  bVar6 = lidx < (pCVar3->scan).current_row_index;
  if (lidx == hidx) {
    if (bVar6 || bVar4) {
      pDVar1 = &pCVar3->page;
      ColumnDataCollection::Seek(pCVar3->inputs,lidx,&pCVar3->scan,pDVar1);
      pvVar7 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar3->data = (date_t *)pvVar7->data;
      pvVar7 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar7);
      pCVar3->validity = &pvVar7->validity;
    }
    dVar2.days = pCVar3->data[(uint)((int)lidx - (int)(pCVar3->scan).current_row_index)].days;
    bVar6 = TryCast::Operation<duckdb::date_t,duckdb::timestamp_t>(dVar2,&local_58,false);
    if (!bVar6) {
      auVar9 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::date_t,duckdb::timestamp_t>
                (&local_50,(duckdb *)(ulong)(uint)dVar2.days,(date_t)auVar9._8_4_);
      InvalidInputException::InvalidInputException(auVar9._0_8_,&local_50);
      __cxa_throw(auVar9._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
  }
  else {
    if (bVar6 || bVar4) {
      pDVar1 = &pCVar3->page;
      ColumnDataCollection::Seek(pCVar3->inputs,lidx,&pCVar3->scan,pDVar1);
      pvVar7 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar3->data = (date_t *)pvVar7->data;
      pvVar7 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar7);
      pCVar3->validity = &pvVar7->validity;
    }
    dVar2.days = pCVar3->data[(uint)((int)lidx - (int)(pCVar3->scan).current_row_index)].days;
    bVar6 = TryCast::Operation<duckdb::date_t,duckdb::timestamp_t>(dVar2,&local_58,false);
    tVar5.value = local_58.value;
    if (!bVar6) {
      auVar9 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::date_t,duckdb::timestamp_t>
                (&local_50,(duckdb *)(ulong)(uint)dVar2.days,(date_t)auVar9._8_4_);
      InvalidInputException::InvalidInputException(auVar9._0_8_,&local_50);
      __cxa_throw(auVar9._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
    pCVar3 = accessor->data;
    if (((pCVar3->scan).next_row_index <= hidx) || (hidx < (pCVar3->scan).current_row_index)) {
      pDVar1 = &pCVar3->page;
      ColumnDataCollection::Seek(pCVar3->inputs,hidx,&pCVar3->scan,pDVar1);
      pvVar7 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar3->data = (date_t *)pvVar7->data;
      pvVar7 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar7);
      pCVar3->validity = &pvVar7->validity;
    }
    dVar2.days = pCVar3->data[(uint)((int)hidx - (int)(pCVar3->scan).current_row_index)].days;
    bVar6 = TryCast::Operation<duckdb::date_t,duckdb::timestamp_t>(dVar2,&local_58,false);
    if (!bVar6) {
      auVar9 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::date_t,duckdb::timestamp_t>
                (&local_50,(duckdb *)(ulong)(uint)dVar2.days,(date_t)auVar9._8_4_);
      InvalidInputException::InvalidInputException(auVar9._0_8_,&local_50);
      __cxa_throw(auVar9._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
    dVar8 = this->RN -
            (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0));
    local_58.value = llround(dVar8 * (double)local_58.value + (1.0 - dVar8) * (double)tVar5.value);
  }
  return (timestamp_t)local_58.value;
}

Assistant:

TARGET_TYPE Interpolate(INPUT_TYPE lidx, INPUT_TYPE hidx, Vector &result, const ACCESSOR &accessor) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		if (lidx == hidx) {
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
		} else {
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(hidx), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}